

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O1

void __thiscall
chrono::ChLoad<chrono::ChLoaderGravity>::LoadIntLoadResidual_F
          (ChLoad<chrono::ChLoaderGravity> *this,ChVectorDynamic<> *R,double c)

{
  undefined1 auVar1 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  double *pdVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  element_type *peVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  iVar8 = 0;
  uVar7 = 0;
  do {
    peVar12 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
              super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar12 == (element_type *)0x0) {
      peVar12 = (element_type *)0x0;
    }
    else {
      peVar12 = peVar12 + *(long *)(*(long *)peVar12 + -0x78);
    }
    p_Var2 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
             super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    iVar5 = (**(code **)(*(long *)peVar12 + 0x40))();
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (iVar5 <= iVar8) {
      return;
    }
    peVar12 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
              super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar12 == (element_type *)0x0) {
      peVar12 = (element_type *)0x0;
    }
    else {
      peVar12 = peVar12 + *(long *)(*(long *)peVar12 + -0x78);
    }
    p_Var2 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
             super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    cVar4 = (**(code **)(*(long *)peVar12 + 0x58))(peVar12,iVar8);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    if (cVar4 != '\0') {
      peVar12 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
                super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar12 == (element_type *)0x0) {
        peVar12 = (element_type *)0x0;
      }
      else {
        peVar12 = peVar12 + *(long *)(*(long *)peVar12 + -0x78);
      }
      p_Var2 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
               super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      iVar5 = (**(code **)(*(long *)peVar12 + 0x48))(peVar12,iVar8);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      uVar11 = 0;
      while( true ) {
        peVar12 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
                  super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar12 == (element_type *)0x0) {
          peVar12 = (element_type *)0x0;
        }
        else {
          peVar12 = peVar12 + *(long *)(*(long *)peVar12 + -0x78);
        }
        p_Var2 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
                 super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        uVar6 = (**(code **)(*(long *)peVar12 + 0x50))(peVar12,iVar8);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        if (uVar6 <= uVar11) break;
        uVar9 = uVar7 + uVar11 & 0xffffffff;
        if (*(Index *)((long)&(this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.
                              super_ChLoader.Q.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage + 8) <= (long)uVar9) {
LAB_0012742d:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        uVar10 = (ulong)(uint)(iVar5 + (int)uVar11);
        if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
            (long)uVar10) goto LAB_0012742d;
        auVar13._8_8_ = 0;
        auVar13._0_8_ =
             (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader.Q.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar9];
        pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = c;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = pdVar3[uVar10];
        auVar1 = vfmadd213sd_fma(auVar13,auVar14,auVar1);
        pdVar3[uVar10] = auVar1._0_8_;
        uVar11 = uVar11 + 1;
      }
      uVar7 = uVar7 + (int)uVar11;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

inline void ChLoad<Tloader>::LoadIntLoadResidual_F(ChVectorDynamic<>& R, double c) {
    unsigned int rowQ = 0;
    for (int i = 0; i < this->loader.GetLoadable()->GetSubBlocks(); ++i) {
        if (this->loader.GetLoadable()->IsSubBlockActive(i)) {
            unsigned int moffset = this->loader.GetLoadable()->GetSubBlockOffset(i);
            for (unsigned int row = 0; row < this->loader.GetLoadable()->GetSubBlockSize(i); ++row) {
                R(row + moffset) += this->loader.Q(rowQ) * c;
                ++rowQ;
            }
        }
    }
}